

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[29],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  ProString *pPVar1;
  QChar *pQVar2;
  char16_t *pcVar3;
  CutResult CVar4;
  char16_t *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar7.m_data = *(p->a).a.a;
  QVar7.m_size = 0x1c;
  QAbstractConcatenable::convertFromUtf8(QVar7,out);
  pPVar1 = (p->a).a.b;
  lVar6 = (long)pPVar1->m_length;
  if (lVar6 != 0) {
    pQVar2 = *out;
    pcVar3 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar6;
    CVar4 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    if (CVar4 != Null) {
      pcVar5 = pcVar3 + local_40;
    }
    memcpy(pQVar2,pcVar5,lVar6 * 2);
    *out = *out + lVar6;
  }
  QVar8.m_data = *(p->a).b;
  QVar8.m_size = 1;
  QAbstractConcatenable::convertFromUtf8(QVar8,out);
  pPVar1 = p->b;
  lVar6 = (long)pPVar1->m_length;
  if (lVar6 != 0) {
    pQVar2 = *out;
    pcVar3 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar6;
    CVar4 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    if (CVar4 != Null) {
      pcVar5 = pcVar3 + local_40;
    }
    memcpy(pQVar2,pcVar5,lVar6 * 2);
    *out = *out + lVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }